

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-gtest-all.cc
# Opt level: O0

void __thiscall
testing::internal::ExpectationBase::FindUnsatisfiedPrerequisites
          (ExpectationBase *this,ExpectationSet *result)

{
  bool bVar1;
  const_iterator result_00;
  const_iterator this_00;
  pointer pEVar2;
  linked_ptr<testing::internal::ExpectationBase> *plVar3;
  ExpectationBase *pEVar4;
  ExpectationBase *in_RSI;
  ExpectationSet *in_RDI;
  const_iterator it;
  
  MutexBase::AssertHeld((MutexBase *)it._M_node);
  result_00 = ExpectationSet::begin(in_RDI);
  while( true ) {
    this_00 = ExpectationSet::end(in_RDI);
    bVar1 = std::operator!=((_Self *)&stack0xffffffffffffffe8,(_Self *)&stack0xffffffffffffffe0);
    if (!bVar1) break;
    pEVar2 = std::_Rb_tree_const_iterator<testing::Expectation>::operator->
                       ((_Rb_tree_const_iterator<testing::Expectation> *)this_00._M_node);
    plVar3 = Expectation::expectation_base(pEVar2);
    linked_ptr<testing::internal::ExpectationBase>::operator->(plVar3);
    bVar1 = IsSatisfied((ExpectationBase *)this_00._M_node);
    if (bVar1) {
      pEVar2 = std::_Rb_tree_const_iterator<testing::Expectation>::operator->
                         ((_Rb_tree_const_iterator<testing::Expectation> *)this_00._M_node);
      plVar3 = Expectation::expectation_base(pEVar2);
      pEVar4 = linked_ptr<testing::internal::ExpectationBase>::operator->(plVar3);
      if (pEVar4->call_count_ == 0) {
        pEVar2 = std::_Rb_tree_const_iterator<testing::Expectation>::operator->
                           ((_Rb_tree_const_iterator<testing::Expectation> *)this_00._M_node);
        plVar3 = Expectation::expectation_base(pEVar2);
        linked_ptr<testing::internal::ExpectationBase>::operator->(plVar3);
        FindUnsatisfiedPrerequisites(in_RSI,(ExpectationSet *)result_00._M_node);
      }
    }
    else {
      std::_Rb_tree_const_iterator<testing::Expectation>::operator*
                ((_Rb_tree_const_iterator<testing::Expectation> *)0x15512d);
      ExpectationSet::operator+=((ExpectationSet *)in_RSI,(Expectation *)result_00._M_node);
    }
    std::_Rb_tree_const_iterator<testing::Expectation>::operator++
              ((_Rb_tree_const_iterator<testing::Expectation> *)this_00._M_node);
  }
  return;
}

Assistant:

GTEST_EXCLUSIVE_LOCK_REQUIRED_(g_gmock_mutex) {
  g_gmock_mutex.AssertHeld();
  for (ExpectationSet::const_iterator it = immediate_prerequisites_.begin();
       it != immediate_prerequisites_.end(); ++it) {
    if (it->expectation_base()->IsSatisfied()) {
      // If *it is satisfied and has a call count of 0, some of its
      // pre-requisites may not be satisfied yet.
      if (it->expectation_base()->call_count_ == 0) {
        it->expectation_base()->FindUnsatisfiedPrerequisites(result);
      }
    } else {
      // Now that we know *it is unsatisfied, we are not so interested
      // in whether its pre-requisites are satisfied.  Therefore we
      // don't recursively call FindUnsatisfiedPrerequisites() here.
      *result += *it;
    }
  }
}